

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

int ON_BrepMergeFaces(ON_Brep *B,int fid0,int fid1)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ON_BrepLoop *loop;
  int iVar4;
  int iVar5;
  ON_BrepEdge *pOVar6;
  ON_BrepFace *pOVar7;
  ulong uVar8;
  ulong uVar9;
  ON_Surface *pOVar10;
  ON_BrepFace *pOVar11;
  long lVar12;
  ON_BrepTrim *pOVar13;
  ON_BrepLoop *pOVar14;
  ulong uVar15;
  ON_BrepFace *pOVar16;
  long lVar17;
  ulong uVar18;
  ON_BrepLoop *pOVar19;
  ON_BrepTrim *pOVar20;
  ON_SimpleArray<int> new_tids;
  
  if (((-1 < fid0 && fid0 != fid1) &&
      (uVar1 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count,
      fid0 < (int)uVar1)) && ((uint)fid1 < uVar1)) {
    pOVar11 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if ((-1 < (pOVar11[(uint)fid0].m_face_index | fid1)) && (-1 < pOVar11[(uint)fid1].m_face_index))
    {
      pOVar16 = pOVar11 + (uint)fid0;
      pOVar11 = pOVar11 + (uint)fid1;
      if (pOVar16->m_si == pOVar11->m_si) {
        uVar9 = 0xffffffffffffffff;
        uVar1 = 0xffffffff;
        pOVar6 = (ON_BrepEdge *)0x0;
        for (lVar12 = 0; (pOVar6 == (ON_BrepEdge *)0x0 && (lVar12 < (pOVar16->m_li).m_count));
            lVar12 = lVar12 + 1) {
          iVar5 = (pOVar16->m_li).m_a[lVar12];
          pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
          for (lVar17 = 0; lVar17 < pOVar14[iVar5].m_ti.m_count; lVar17 = lVar17 + 1) {
            pOVar13 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                      m_a + pOVar14[iVar5].m_ti.m_a[lVar17];
            pOVar6 = ON_BrepTrim::Edge(pOVar13);
            if ((pOVar6 != (ON_BrepEdge *)0x0) && ((pOVar6->m_ti).m_count == 2)) {
              uVar1 = pOVar13->m_trim_index;
              puVar3 = (uint *)(pOVar6->m_ti).m_a;
              uVar2 = puVar3[*puVar3 == uVar1];
              uVar9 = (ulong)uVar2;
              if ((-1 < (int)uVar1) && (-1 < (int)uVar2)) {
                pOVar20 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a + uVar9;
                iVar4 = ON_BrepTrim::FaceIndexOf(pOVar20);
                if (((iVar4 == fid1) && (pOVar13->m_bRev3d != pOVar20->m_bRev3d)) &&
                   (pOVar13->m_iso == pOVar20->m_iso)) goto LAB_0043ec39;
              }
            }
          }
          pOVar6 = (ON_BrepEdge *)0x0;
LAB_0043ec39:
        }
        if (((pOVar6 != (ON_BrepEdge *)0x0) && (-1 < (int)uVar1)) && (-1 < (int)uVar9)) {
          pOVar13 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
          lVar12 = (long)pOVar13[uVar1].m_li;
          if ((-1 < lVar12) &&
             (pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                        m_a, -1 < pOVar14[lVar12].m_loop_index)) {
            pOVar14 = pOVar14 + lVar12;
            pOVar7 = ON_BrepLoop::Face(pOVar14);
            if (pOVar7 == pOVar16) {
              pOVar20 = pOVar13 + (uVar9 & 0xffffffff);
              uVar2 = (pOVar14->m_ti).m_count;
              uVar18 = 0;
              uVar15 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar15 = uVar18;
              }
              for (; uVar15 != uVar18; uVar18 = uVar18 + 1) {
                if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                    [(pOVar14->m_ti).m_a[uVar18]].m_trim_index == uVar1) {
                  lVar12 = (long)pOVar20->m_li;
                  if (lVar12 < 0) {
                    return -1;
                  }
                  pOVar19 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                            super_ON_ClassArray<ON_BrepLoop>.m_a;
                  if (pOVar19[lVar12].m_loop_index < 0) {
                    return -1;
                  }
                  pOVar19 = pOVar19 + lVar12;
                  pOVar7 = ON_BrepLoop::Face(pOVar19);
                  if (pOVar7 != pOVar11) {
                    return -1;
                  }
                  uVar18 = uVar18 + 1;
                  uVar2 = (pOVar19->m_ti).m_count;
                  uVar15 = 0;
                  uVar8 = (ulong)uVar2;
                  if ((int)uVar2 < 1) {
                    uVar8 = uVar15;
                  }
                  while( true ) {
                    if (uVar8 == uVar15) {
                      return -1;
                    }
                    if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                        m_a[(pOVar19->m_ti).m_a[uVar15]].m_trim_index == (int)uVar9) break;
                    uVar15 = uVar15 + 1;
                  }
                  new_tids._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
                  new_tids.m_a = (int *)0x0;
                  new_tids.m_count = 0;
                  new_tids.m_capacity = 0;
                  ON_SimpleArray<int>::Reserve
                            (&new_tids,
                             (long)((pOVar14->m_ti).m_count + (pOVar19->m_ti).m_count + -2));
                  uVar15 = uVar15 + 1;
                  iVar5 = (pOVar14->m_ti).m_count;
                  iVar4 = 1;
                  if (1 < iVar5) {
                    iVar4 = iVar5;
                  }
                  while (iVar4 = iVar4 + -1, iVar4 != 0) {
                    ON_SimpleArray<int>::Append
                              (&new_tids,
                               (pOVar14->m_ti).m_a +
                               ((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 |
                                      uVar18 & 0xffffffff) % (long)iVar5 & 0xffffffff));
                    uVar18 = (ulong)((int)uVar18 + 1);
                  }
                  iVar5 = (pOVar19->m_ti).m_count;
                  iVar4 = 1;
                  if (1 < iVar5) {
                    iVar4 = iVar5;
                  }
                  while (iVar4 = iVar4 + -1, iVar4 != 0) {
                    ON_SimpleArray<int>::Append
                              (&new_tids,
                               (pOVar19->m_ti).m_a +
                               ((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                      uVar15 & 0xffffffff) % (long)iVar5 & 0xffffffff));
                    uVar15 = (ulong)((int)uVar15 + 1);
                  }
                  loop = pOVar19;
                  pOVar7 = pOVar16;
                  if (pOVar19->m_type == inner) {
                    fid0 = fid1;
                    loop = pOVar14;
                    pOVar14 = pOVar19;
                    pOVar7 = pOVar11;
                    pOVar11 = pOVar16;
                  }
                  ON_SimpleArray<int>::operator=(&pOVar14->m_ti,&new_tids);
                  ON_BoundingBox::Destroy(&pOVar14->m_pbox);
                  if (-1 < (loop->m_ti).m_capacity) {
                    (loop->m_ti).m_count = 0;
                  }
                  pOVar13[uVar1].m_li = -1;
                  pOVar20->m_li = -1;
                  ON_Brep::DeleteTrim(B,pOVar13 + uVar1,true);
                  ON_Brep::DeleteTrim(B,pOVar20,true);
                  ON_Brep::DeleteLoop(B,loop,true);
                  uVar1 = (pOVar14->m_ti).m_count;
                  pOVar13 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                            super_ON_ClassArray<ON_BrepTrim>.m_a;
                  uVar15 = 0;
                  uVar9 = (ulong)uVar1;
                  if ((int)uVar1 < 1) {
                    uVar9 = uVar15;
                  }
                  for (; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                    pOVar13[(pOVar14->m_ti).m_a[uVar15]].m_li = pOVar14->m_loop_index;
                  }
                  ON_Brep::MatchTrimEnds(B,pOVar14);
                  for (lVar12 = 0; lVar12 < (pOVar11->m_li).m_count; lVar12 = lVar12 + 1) {
                    iVar5 = (pOVar11->m_li).m_a[lVar12];
                    pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                              super_ON_ClassArray<ON_BrepLoop>.m_a;
                    pOVar14[iVar5].m_fi = fid0;
                    ON_SimpleArray<int>::Append(&pOVar7->m_li,&pOVar14[iVar5].m_loop_index);
                  }
                  if (-1 < (pOVar11->m_li).m_capacity) {
                    (pOVar11->m_li).m_count = 0;
                  }
                  ON_Brep::DeleteFace(B,pOVar11,true);
                  pOVar10 = ON_BrepFace::SurfaceOf
                                      ((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                       super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
                  iVar5 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                                    (pOVar10,0);
                  if (((char)iVar5 != '\0') ||
                     (iVar5 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                                        (pOVar10,1), (char)iVar5 != '\0')) {
                    ON_Brep::SetTrimTypeFlags
                              (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                 super_ON_ClassArray<ON_BrepFace>.m_a + fid0,false);
                  }
                  ON_BrepRemoveSlits((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                     super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
                  (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                            (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                               super_ON_ClassArray<ON_BrepFace>.m_a + fid0,1);
                  ON_SimpleArray<int>::~ON_SimpleArray(&new_tids);
                  return fid0;
                }
              }
            }
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

int ON_BrepMergeFaces(ON_Brep& B, int fid0, int fid1)

{
  if (fid0 == fid1)
    return -1;

  if (fid0 < 0 || fid0 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F0 = B.m_F[fid0];
  if (F0.m_face_index < 0)
    return -1;

  if (fid1 < 0 || fid1 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F1 = B.m_F[fid1];
  if (F1.m_face_index < 0)
    return -1;

  if (F0.m_si != F1.m_si)
    return -1;

  //Find a manifold edge that joins the two faces and combine the loops by removing 
  //the trims at that edge.

  ON_BrepEdge* pE = 0;

  int li;
  int tid0 = -1, tid1 = -1;
  for (li=0; li<F0.m_li.Count() && !pE; li++){
    ON_BrepLoop& L = B.m_L[F0.m_li[li]];
    int ti;
    for (ti=0; ti<L.m_ti.Count() && !pE; ti++){
      ON_BrepTrim& T0 = B.m_T[L.m_ti[ti]];
      ON_BrepEdge* pEE = T0.Edge();
      if (!pEE || pEE->m_ti.Count() != 2)
        continue;
      tid0 =T0.m_trim_index;
      tid1 = (pEE->m_ti[0] == tid0) ? pEE->m_ti[1] : pEE->m_ti[0];
      if (tid0 < 0 || tid1 < 0)
        continue;
      ON_BrepTrim& T1 = B.m_T[tid1];
      if (T1.FaceIndexOf() == fid1 && T0.m_bRev3d != T1.m_bRev3d 
        && T0.m_iso == T1.m_iso){//Don't combine across seams.
        pE = pEE;
        break;
      }
    }
  }

  if (!pE || tid0 < 0 || tid1 < 0)
    return -1;

  ON_BrepTrim& T0 = B.m_T[tid0];
  ON_BrepTrim& T1 = B.m_T[tid1];

  int lid0 = T0.m_li;
  if (lid0 < 0)
    return -1;
  ON_BrepLoop& L0 = B.m_L[lid0];
  if (L0.m_loop_index < 0)
    return -1;
  if (L0.Face() != &F0)
    return -1;
  int i;
  int ti0 = -1;
  for (i=0; i<L0.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L0.m_ti[i]];
    if (T.m_trim_index == tid0){
      ti0 = i;
      break;
    }
  }
  if (ti0 < 0)
    return -1;

  int lid1 = T1.m_li;
  if (lid1 < 0)
    return -1;
  ON_BrepLoop& L1 = B.m_L[lid1];
  if (L1.m_loop_index < 0)
    return -1;
  if (L1.Face() != &F1)
    return -1;
  int ti1 = -1;
  for (i=0; i<L1.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L1.m_ti[i]];
    if (T.m_trim_index == tid1){
      ti1 = i;
      break;
    }
  }
  if (ti1 < 0)
    return -1;


  ON_SimpleArray<int> new_tids;
  CreateNewTrimList(L0, ti0, L1, ti1, new_tids);

  ON_BrepLoop* pL;
  ON_BrepLoop* pD;
  ON_BrepFace* pF;
  ON_BrepFace* pDF;
  int rc;
  if (L1.m_type != ON_BrepLoop::inner){
    pL = &L0;
    pD = &L1;
    rc = fid0;
    pF = &F0;
    pDF = &F1;
  }
  else {
    pL = &L1;
    pD = &L0;
    rc = fid1;
    pF = &F1;
    pDF = &F0;
  }
  pL->m_ti = new_tids;
  pL->m_pbox.Destroy();
  pD->m_ti.SetCount(0);
  T0.m_li = -1;
  T1.m_li = -1;
  B.DeleteTrim(T0, true);
  B.DeleteTrim(T1, true);
  B.DeleteLoop(*pD, true);
  for (i=0; i<pL->m_ti.Count(); i++)
    B.m_T[pL->m_ti[i]].m_li = pL->m_loop_index;

  B.MatchTrimEnds(*pL);

  for (i=0; i<pDF->m_li.Count(); i++){
    ON_BrepLoop& ML = B.m_L[pDF->m_li[i]];
    ML.m_fi = rc;
    pF->m_li.Append(ML.m_loop_index);
  }
  pDF->m_li.SetCount(0);
  B.DeleteFace(*pDF, true);
  const ON_Surface* pSrf = B.m_F[rc].SurfaceOf();
  if (pSrf->IsClosed(0) || pSrf->IsClosed(1))
    B.SetTrimTypeFlags(B.m_F[rc]);//Some mateds may have become seams.
  ON_BrepRemoveSlits(B.m_F[rc]);

  B.SetTrimBoundingBoxes(B.m_F[rc], true);

  return rc;

}